

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorWell::dropEvent(QColorWell *this,QDropEvent *e)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  QDropEvent QVar4;
  LayoutDirection LVar5;
  undefined4 uVar6;
  ulong uVar7;
  QMetaType QVar8;
  int iVar9;
  anon_union_24_3_e3d07ef4_for_data *paVar10;
  long in_FS_OFFSET;
  undefined8 uVar11;
  undefined8 uVar12;
  double dVar13;
  QMetaType local_80;
  undefined1 *local_78;
  undefined8 uStack_70;
  QMetaType local_68;
  undefined4 uStack_60;
  undefined2 uStack_5c;
  undefined2 uStack_5a;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  paVar10 = &local_58;
  QMimeData::colorData();
  local_80.d_ptr = &QMetaTypeInterfaceWrapper<QColor>::metaType;
  uVar7 = CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc;
  local_68.d_ptr._0_4_ = (int)uVar7;
  local_68.d_ptr._4_2_ = (undefined2)(uVar7 >> 0x20);
  local_68.d_ptr._6_2_ = (undefined2)(uVar7 >> 0x30);
  bVar3 = comparesEqual(&local_68,&local_80);
  if (bVar3) {
    uVar11 = local_58.shared;
    uVar12 = local_58._8_8_;
    if ((local_40 & 1) != 0) {
      uVar11 = *(long *)(local_58.shared + *(int *)(local_58.shared + 4));
      uVar12 = *(QMetaType **)(local_58.shared + *(int *)(local_58.shared + 4) + 8);
    }
    local_68.d_ptr._0_4_ = (int)uVar11;
    local_68.d_ptr._4_2_ = (undefined2)((ulong)uVar11 >> 0x20);
    local_68.d_ptr._6_2_ = (undefined2)((ulong)uVar11 >> 0x30);
    uStack_60 = (undefined4)uVar12;
    uStack_5c = (undefined2)((ulong)uVar12 >> 0x20);
    uStack_5a = (undefined2)((ulong)uVar12 >> 0x30);
  }
  else {
    uStack_5a = 0xaaaa;
    local_68.d_ptr._0_4_ = 0;
    local_68.d_ptr._4_2_ = 0xffff;
    local_68.d_ptr._6_2_ = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_40 & 1) != 0) {
      paVar10 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_58.shared + *(int *)(local_58.shared + 4));
    }
    QMetaType::convert(QVar8,paVar10,local_80,&local_68);
  }
  iVar9 = (int)local_68.d_ptr;
  local_78 = (undefined1 *)
             CONCAT26(local_68.d_ptr._6_2_,CONCAT24(local_68.d_ptr._4_2_,(int)local_68.d_ptr));
  uStack_70._0_6_ = CONCAT24(uStack_5c,uStack_60);
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (iVar9 == 0) {
    QVar4 = (QDropEvent)0x0;
  }
  else {
    dVar13 = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x10);
    bVar3 = 2147483647.0 < dVar13;
    if (dVar13 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    iVar9 = (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar13);
    dVar13 = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
             *(double *)(e + 0x18);
    bVar3 = 2147483647.0 < dVar13;
    if (dVar13 <= -2147483648.0) {
      dVar13 = -2147483648.0;
    }
    iVar1 = (this->super_QWellArray).cellh;
    LVar5 = QWidget::layoutDirection((QWidget *)this);
    if (LVar5 == RightToLeft) {
      iVar9 = ~(iVar9 / (this->super_QWellArray).cellw) + (this->super_QWellArray).ncols;
    }
    else {
      iVar9 = iVar9 / (this->super_QWellArray).cellw;
    }
    iVar2 = (this->super_QWellArray).nrows;
    uVar6 = QColor::rgb();
    local_80.d_ptr._0_4_ = uVar6;
    local_58.shared = (PrivateShared *)0x0;
    local_68.d_ptr._0_4_ =
         iVar9 * iVar2 +
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar13) / iVar1;
    local_58._8_8_ = &local_68;
    local_58._16_8_ = &local_80;
    QMetaObject::activate((QObject *)this,&QWellArray::staticMetaObject,2,&local_58.shared);
    QVar4 = (QDropEvent)0x1;
  }
  e[0xc] = QVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorWell::dropEvent(QDropEvent *e)
{
    QColor col = qvariant_cast<QColor>(e->mimeData()->colorData());
    if (col.isValid()) {
        int i = rowAt(e->position().toPoint().y()) + columnAt(e->position().toPoint().x()) * numRows();
        emit colorChanged(i, col.rgb());
        e->accept();
    } else {
        e->ignore();
    }
}